

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-skt.c
# Opt level: O1

int rops_handle_POLLIN_raw_skt(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  lws *plVar5;
  lws_context *plVar6;
  int iVar7;
  char *format;
  lws_tokens *ebuf_00;
  uint16_t u16;
  lws_tokens ebuf;
  ushort local_32;
  lws_tokens local_30;
  
  if (wsi->buflist_out != (lws_buflist *)0x0) {
    ebuf_00 = (lws_tokens *)0x5;
    if (((pollfd->revents & 4) == 0) || (iVar3 = lws_issue_raw(wsi,(uchar *)0x0,0), -1 < iVar3))
    goto LAB_0012571a;
    goto LAB_00125703;
  }
  uVar1 = wsi->wsistate;
  if ((uVar1 & 0xffff) != 0x119 && ((byte)(uVar1 >> 0x1c) & 1) == 0) {
    _lws_log(0x10,"%s: %p: wsistate 0x%x\n","rops_handle_POLLIN_raw_skt",wsi);
    if ((short)wsi->wsistate != 0x208) {
      iVar3 = lws_server_socket_service_ssl(wsi,-1);
      ebuf_00 = (lws_tokens *)0x6;
      if (iVar3 != 0) goto LAB_0012571a;
    }
    ebuf_00 = (lws_tokens *)0x5;
    goto LAB_0012571a;
  }
  uVar2 = pollfd->events & pollfd->revents;
  if (((((uVar2 & 1) == 0) || ((uVar1 & 0xffff) == 0x202)) || ((uVar1 & 0xffff) == 0x209)) ||
     (((uVar2 & 4) != 0 && ((*(ulong *)&wsi->field_0x2dc & 0x80000) != 0)))) {
    if ((uVar2 & 4) != 0 && ((uint)*(ulong *)&wsi->field_0x2dc >> 0x13 & 1) != 0) {
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffff7ffff;
    }
LAB_00125591:
    ebuf_00 = (lws_tokens *)0x5;
    if ((pollfd->revents & 4) == 0) goto LAB_0012571a;
    if (((short)wsi->wsistate != 0x202) ||
       (plVar5 = lws_client_connect_3_connect(wsi,(char *)0x0,(addrinfo *)0x0,0,(void *)0x0),
       plVar5 != (lws *)0x0)) {
      iVar3 = lws_change_pollfd(wsi,4,0);
      if (iVar3 == 0) {
        wsi->field_0x2e1 = wsi->field_0x2e1 & 0xfb;
        iVar3 = user_callback_handle_rxflow
                          (wsi->protocol->callback,wsi,LWS_CALLBACK_RAW_WRITEABLE,wsi->user_space,
                           (void *)0x0,0);
        if (-1 < iVar3) goto LAB_0012571a;
        format = "writeable_fail\n";
        goto LAB_00125682;
      }
      _lws_log(4,"%s a\n","rops_handle_POLLIN_raw_skt");
      goto LAB_00125703;
    }
  }
  else {
    ebuf_00 = &local_30;
    local_30.token = (uchar *)0x0;
    local_30.len = 0;
    iVar3 = lws_buflist_aware_read(pt,wsi,ebuf_00,'\x01',"rops_handle_POLLIN_raw_skt");
    if (local_30.len == 0xfffffffc) goto LAB_00125591;
    if (local_30.len != 0xffffffff) {
      if (local_30.len == 0) {
        _lws_log(8,"%s: read 0 len\n","rops_handle_POLLIN_raw_skt");
        wsi->field_0x2df = wsi->field_0x2df | 0x40;
        lws_change_pollfd(wsi,1,0);
        goto LAB_00125703;
      }
      if (wsi->context->udp_loss_sim_rx_pc == '\0') {
LAB_001257a6:
        iVar4 = user_callback_handle_rxflow
                          (wsi->protocol->callback,wsi,LWS_CALLBACK_RAW_RX,wsi->user_space,
                           local_30.token,(long)local_30.len);
      }
      else {
        plVar6 = (lws_context *)lws_get_random(wsi->context,&local_32,2);
        iVar7 = 0;
        if ((plVar6 == (lws_context *)0x2) &&
           (plVar6 = wsi->context,
           ((uint)local_32 * 100) / 0xffff <= (uint)plVar6->udp_loss_sim_rx_pc)) {
          _lws_log(2,"%s: dropping udp rx\n","rops_handle_POLLIN_raw_skt");
          iVar7 = 5;
          plVar6 = (lws_context *)(ulong)(uint)local_30.len;
        }
        iVar4 = (int)plVar6;
        if (iVar7 != 5) {
          if (iVar7 != 0) goto LAB_0012571a;
          goto LAB_001257a6;
        }
      }
      if (-1 < iVar4) {
        iVar3 = lws_buflist_aware_finished_consuming
                          (wsi,&local_30,local_30.len,iVar3,"rops_handle_POLLIN_raw_skt");
        ebuf_00 = (lws_tokens *)0x6;
        if (iVar3 != 0) goto LAB_0012571a;
        goto LAB_00125591;
      }
      format = "LWS_CALLBACK_RAW_RX_fail\n";
LAB_00125682:
      _lws_log(8,format);
    }
LAB_00125703:
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"raw svc fail");
  }
  ebuf_00 = (lws_tokens *)0x4;
LAB_0012571a:
  return (int)ebuf_00;
}

Assistant:

static int
rops_handle_POLLIN_raw_skt(struct lws_context_per_thread *pt, struct lws *wsi,
			   struct lws_pollfd *pollfd)
{
	struct lws_tokens ebuf;
	int n, buffered;

	/* pending truncated sends have uber priority */

	if (lws_has_buffered_out(wsi)) {
		if (!(pollfd->revents & LWS_POLLOUT))
			return LWS_HPI_RET_HANDLED;

		/* drain the output buflist */
		if (lws_issue_raw(wsi, NULL, 0) < 0)
			goto fail;
		/*
		 * we can't afford to allow input processing to send
		 * something new, so spin around he event loop until
		 * he doesn't have any partials
		 */
		return LWS_HPI_RET_HANDLED;
	}


#if defined(LWS_WITH_SERVER)
	if (!lwsi_role_client(wsi) &&  lwsi_state(wsi) != LRS_ESTABLISHED) {

		lwsl_debug("%s: %p: wsistate 0x%x\n", __func__, wsi,
			   (int)wsi->wsistate);

		if (lwsi_state(wsi) != LRS_SSL_INIT)
			if (lws_server_socket_service_ssl(wsi,
							  LWS_SOCK_INVALID))
				return LWS_HPI_RET_PLEASE_CLOSE_ME;

		return LWS_HPI_RET_HANDLED;
	}
#endif

	if ((pollfd->revents & pollfd->events & LWS_POLLIN) &&
	    /* any tunnel has to have been established... */
	    lwsi_state(wsi) != LRS_SSL_ACK_PENDING &&
	    /* we are actually connected */
	    lwsi_state(wsi) != LRS_WAITING_CONNECT &&
	    !(wsi->favoured_pollin &&
	      (pollfd->revents & pollfd->events & LWS_POLLOUT))) {

		ebuf.token = NULL;
		ebuf.len = 0;

		buffered = lws_buflist_aware_read(pt, wsi, &ebuf, 1, __func__);
		switch (ebuf.len) {
		case 0:
			lwsl_info("%s: read 0 len\n", __func__);
			wsi->seen_zero_length_recv = 1;
			if (lws_change_pollfd(wsi, LWS_POLLIN, 0))
				goto fail;

			/*
			 * we need to go to fail here, since it's the only
			 * chance we get to understand that the socket has
			 * closed
			 */
			// goto try_pollout;
			goto fail;

		case LWS_SSL_CAPABLE_ERROR:
			goto fail;
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			goto try_pollout;
		}

#if defined(LWS_WITH_UDP)
		if (wsi->context->udp_loss_sim_rx_pc) {
			uint16_t u16;
			/*
			 * We should randomly drop some of these
			 */

			if (lws_get_random(wsi->context, &u16, 2) == 2 &&
			    ((u16 * 100) / 0xffff) <=
				    wsi->context->udp_loss_sim_rx_pc) {
				lwsl_warn("%s: dropping udp rx\n", __func__);
				/* pretend it was handled */
				n = ebuf.len;
				goto post_rx;
			}
		}
#endif

		n = user_callback_handle_rxflow(wsi->protocol->callback,
						wsi, LWS_CALLBACK_RAW_RX,
						wsi->user_space, ebuf.token,
						ebuf.len);
#if defined(LWS_WITH_UDP)
post_rx:
#endif
		if (n < 0) {
			lwsl_info("LWS_CALLBACK_RAW_RX_fail\n");
			goto fail;
		}

		if (lws_buflist_aware_finished_consuming(wsi, &ebuf, ebuf.len,
							 buffered, __func__))
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
	} else
		if (wsi->favoured_pollin &&
		    (pollfd->revents & pollfd->events & LWS_POLLOUT))
			/* we balanced the last favouring of pollin */
			wsi->favoured_pollin = 0;

try_pollout:

	if (!(pollfd->revents & LWS_POLLOUT))
		return LWS_HPI_RET_HANDLED;

#if defined(LWS_WITH_CLIENT)
	if (lwsi_state(wsi) == LRS_WAITING_CONNECT &&
	    !lws_client_connect_3_connect(wsi, NULL, NULL, 0, NULL))
		return LWS_HPI_RET_WSI_ALREADY_DIED;
#endif

	/* one shot */
	if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
		lwsl_notice("%s a\n", __func__);
		goto fail;
	}

	/* clear back-to-back write detection */
	wsi->could_have_pending = 0;

	lws_stats_bump(pt, LWSSTATS_C_WRITEABLE_CB, 1);
#if defined(LWS_WITH_STATS)
	if (wsi->active_writable_req_us) {
		uint64_t ul = lws_now_usecs() -
				wsi->active_writable_req_us;

		lws_stats_bump(pt, LWSSTATS_US_WRITABLE_DELAY_AVG, ul);
		lws_stats_max(pt,
			  LWSSTATS_US_WORST_WRITABLE_DELAY, ul);
		wsi->active_writable_req_us = 0;
	}
#endif
	n = user_callback_handle_rxflow(wsi->protocol->callback,
			wsi, LWS_CALLBACK_RAW_WRITEABLE,
			wsi->user_space, NULL, 0);
	if (n < 0) {
		lwsl_info("writeable_fail\n");
		goto fail;
	}

	return LWS_HPI_RET_HANDLED;

fail:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "raw svc fail");

	return LWS_HPI_RET_WSI_ALREADY_DIED;
}